

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttkern.c
# Opt level: O0

FT_Error tt_face_load_kern(TT_Face face,FT_Stream stream)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  uchar *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  FT_Byte *pFVar9;
  FT_UInt32 cur_pair;
  FT_ULong old_pair;
  FT_ULong count;
  FT_Byte *pFStack_60;
  FT_UInt32 mask;
  FT_Byte *p_next;
  FT_UInt format;
  FT_UInt coverage;
  FT_UInt length;
  FT_UInt num_pairs;
  FT_UInt32 ordered;
  FT_UInt32 avail;
  FT_UInt num_tables;
  FT_UInt nn;
  FT_Byte *p_limit;
  FT_Byte *p;
  FT_ULong table_size;
  FT_Stream pFStack_18;
  FT_Error error;
  FT_Stream stream_local;
  TT_Face face_local;
  
  num_pairs = 0;
  length = 0;
  pFStack_18 = stream;
  stream_local = (FT_Stream)face;
  table_size._4_4_ = (*face->goto_table)(face,0x6b65726e,stream,(FT_ULong *)&p);
  if (table_size._4_4_ == 0) {
    if (p < (FT_Byte *)0x4) {
      table_size._4_4_ = 0x8e;
    }
    else {
      table_size._4_4_ = FT_Stream_ExtractFrame(pFStack_18,(FT_ULong)p,&stream_local[0x10].limit);
      if (table_size._4_4_ == 0) {
        stream_local[0x11].base = p;
        puVar5 = stream_local[0x10].limit;
        pFVar9 = puVar5 + (long)p;
        p_limit = puVar5 + 4;
        ordered = (FT_UInt32)CONCAT11(puVar5[2],puVar5[3]);
        if (0x20 < ordered) {
          ordered = 0x20;
        }
        avail = 0;
        while ((avail < ordered && (uVar6 = 1 << ((byte)avail & 0x1f), p_limit + 6 <= pFVar9))) {
          if (CONCAT11(p_limit[2],p_limit[3]) < 0xf) break;
          pFStack_60 = p_limit + (uint)CONCAT11(p_limit[2],p_limit[3]);
          if (pFVar9 < p_limit + (uint)CONCAT11(p_limit[2],p_limit[3])) {
            pFStack_60 = pFVar9;
          }
          if (((p_limit[4] == '\0') && ((p_limit[5] & 3) == 1)) && (p_limit + 0xe <= pFStack_60)) {
            coverage = (FT_UInt)CONCAT11(p_limit[6],p_limit[7]);
            if ((long)pFStack_60 - (long)(p_limit + 0xe) < (long)(int)(coverage * 6)) {
              coverage = (FT_UInt)(((long)pFStack_60 - (long)(p_limit + 0xe)) / 6);
            }
            num_pairs = uVar6 | num_pairs;
            if (coverage != 0) {
              pbVar1 = p_limit + 0xe;
              pbVar2 = p_limit + 0xf;
              pbVar3 = p_limit + 0x10;
              pbVar4 = p_limit + 0x11;
              p_limit = p_limit + 0x14;
              old_pair = (FT_ULong)(coverage - 1);
              uVar7 = (uint)*pbVar1 << 0x18 | (uint)*pbVar2 << 0x10 | (uint)*pbVar3 << 8 |
                      (uint)*pbVar4;
              while ((old_pair != 0 &&
                     (uVar8 = (uint)*p_limit << 0x18 | (uint)p_limit[1] << 0x10 |
                              (uint)p_limit[2] << 8 | (uint)p_limit[3], uVar7 <= uVar8))) {
                p_limit = p_limit + 6;
                old_pair = old_pair - 1;
                uVar7 = uVar8;
              }
              if (old_pair == 0) {
                length = uVar6 | length;
              }
            }
          }
          avail = avail + 1;
          p_limit = pFStack_60;
        }
        *(FT_UInt32 *)&stream_local[0x11].size = avail;
        *(FT_UInt *)((long)&stream_local[0x11].size + 4) = num_pairs;
        *(FT_UInt *)&stream_local[0x11].pos = length;
      }
    }
  }
  return table_size._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_kern( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error   error;
    FT_ULong   table_size;
    FT_Byte*   p;
    FT_Byte*   p_limit;
    FT_UInt    nn, num_tables;
    FT_UInt32  avail = 0, ordered = 0;


    /* the kern table is optional; exit silently if it is missing */
    error = face->goto_table( face, TTAG_kern, stream, &table_size );
    if ( error )
      goto Exit;

    if ( table_size < 4 )  /* the case of a malformed table */
    {
      FT_ERROR(( "tt_face_load_kern:"
                 " kerning table is too small - ignored\n" ));
      error = FT_THROW( Table_Missing );
      goto Exit;
    }

    if ( FT_FRAME_EXTRACT( table_size, face->kern_table ) )
    {
      FT_ERROR(( "tt_face_load_kern:"
                 " could not extract kerning table\n" ));
      goto Exit;
    }

    face->kern_table_size = table_size;

    p       = face->kern_table;
    p_limit = p + table_size;

    p         += 2; /* skip version */
    num_tables = FT_NEXT_USHORT( p );

    if ( num_tables > 32 ) /* we only support up to 32 sub-tables */
      num_tables = 32;

    for ( nn = 0; nn < num_tables; nn++ )
    {
      FT_UInt    num_pairs, length, coverage, format;
      FT_Byte*   p_next;
      FT_UInt32  mask = (FT_UInt32)1UL << nn;


      if ( p + 6 > p_limit )
        break;

      p_next = p;

      p       += 2; /* skip version */
      length   = FT_NEXT_USHORT( p );
      coverage = FT_NEXT_USHORT( p );

      if ( length <= 6 + 8 )
        break;

      p_next += length;

      if ( p_next > p_limit )  /* handle broken table */
        p_next = p_limit;

      format = coverage >> 8;

      /* we currently only support format 0 kerning tables */
      if ( format != 0 )
        goto NextTable;

      /* only use horizontal kerning tables */
      if ( ( coverage & 3U ) != 0x0001 ||
           p + 8 > p_next              )
        goto NextTable;

      num_pairs = FT_NEXT_USHORT( p );
      p        += 6;

      if ( ( p_next - p ) < 6 * (int)num_pairs ) /* handle broken count */
        num_pairs = (FT_UInt)( ( p_next - p ) / 6 );

      avail |= mask;

      /*
       * Now check whether the pairs in this table are ordered.
       * We then can use binary search.
       */
      if ( num_pairs > 0 )
      {
        FT_ULong  count;
        FT_ULong  old_pair;


        old_pair = FT_NEXT_ULONG( p );
        p       += 2;

        for ( count = num_pairs - 1; count > 0; count-- )
        {
          FT_UInt32  cur_pair;


          cur_pair = FT_NEXT_ULONG( p );
          if ( cur_pair < old_pair )
            break;

          p += 2;
          old_pair = cur_pair;
        }

        if ( count == 0 )
          ordered |= mask;
      }

    NextTable:
      p = p_next;
    }

    face->num_kern_tables = nn;
    face->kern_avail_bits = avail;
    face->kern_order_bits = ordered;

  Exit:
    return error;
  }